

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

value * __thiscall
mjs::interpreter::impl::do_binary_op
          (value *__return_storage_ptr__,impl *this,token_type op,value *l,value *r)

{
  uint32_t *__return_storage_ptr___00;
  bool bVar1;
  value_type vVar2;
  int iVar3;
  int32_t iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  wostream *pwVar9;
  value *this_00;
  double dVar10;
  double dVar11;
  byte local_6a2;
  byte local_6a1;
  bool local_68c;
  bool local_68b;
  bool local_68a;
  bool local_689;
  wstring local_638 [32];
  wstring_view local_618;
  wostringstream local_608 [8];
  wostringstream _woss_2;
  double rn;
  double ln;
  wstring local_478 [6];
  bool eq_1;
  bool eq;
  wstring_view local_458;
  wostringstream local_448 [8];
  wostringstream _woss_1;
  int res;
  double rn_1;
  double ln_1;
  wstring_view local_298;
  wostringstream local_288 [8];
  wostringstream _woss;
  value local_110;
  value local_e8;
  string local_c0;
  undefined1 local_b0 [8];
  string rs;
  string ls;
  value local_58;
  value *local_30;
  value *r_local;
  value *l_local;
  impl *piStack_18;
  token_type op_local;
  impl *this_local;
  
  local_30 = r;
  r_local = l;
  l_local._4_4_ = op;
  piStack_18 = this;
  this_local = (impl *)__return_storage_ptr__;
  if (op == plus) {
    to_primitive(&local_58,l,undefined);
    value::operator=(r_local,&local_58);
    value::~value(&local_58);
    __return_storage_ptr___00 = &ls.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_
    ;
    to_primitive((value *)__return_storage_ptr___00,local_30,undefined);
    value::operator=(local_30,(value *)__return_storage_ptr___00);
    value::~value((value *)&ls.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_);
    vVar2 = value::type(r_local);
    if ((vVar2 == string) || (vVar2 = value::type(local_30), vVar2 == string)) {
      to_string((mjs *)&rs.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_,
                this->heap_,r_local);
      to_string((mjs *)local_b0,this->heap_,local_30);
      mjs::operator+((mjs *)&local_c0,
                     (string *)&rs.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_,
                     (string *)local_b0);
      value::value(__return_storage_ptr__,&local_c0);
      string::~string(&local_c0);
      string::~string((string *)local_b0);
      string::~string((string *)&rs.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_
                     );
      return __return_storage_ptr__;
    }
  }
  else {
    bVar1 = is_relational(op);
    if (bVar1) {
      to_primitive(&local_e8,r_local,number);
      value::operator=(r_local,&local_e8);
      value::~value(&local_e8);
      to_primitive(&local_110,local_30,number);
      value::operator=(local_30,&local_110);
      value::~value(&local_110);
      vVar2 = value::type(r_local);
      if ((vVar2 == string) && (vVar2 = value::type(local_30), vVar2 == string)) {
        std::__cxx11::wostringstream::wostringstream(local_288);
        pwVar9 = std::operator<<((wostream *)local_288,"Not implemented: ");
        mjs::operator<<(pwVar9,l_local._4_4_);
        std::__cxx11::wostringstream::str();
        local_298 = (wstring_view)
                    std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&ln_1);
        throw_runtime_error(&local_298,
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                            ,0x2ce);
      }
      dVar10 = to_number(r_local);
      dVar11 = to_number(local_30);
      switch(l_local._4_4_) {
      case ltequal:
        iVar3 = tri_compare(dVar11,dVar10);
        local_68a = iVar3 == -1 || iVar3 == 1;
        value::value(__return_storage_ptr__,(bool)(local_68a - 1U & 1));
        return __return_storage_ptr__;
      case gtequal:
        iVar3 = tri_compare(dVar10,dVar11);
        local_68c = iVar3 == -1 || iVar3 == 1;
        value::value(__return_storage_ptr__,(bool)(local_68c - 1U & 1));
        return __return_storage_ptr__;
      default:
        std::__cxx11::wostringstream::wostringstream(local_448);
        pwVar9 = std::operator<<((wostream *)local_448,"Not implemented: ");
        mjs::operator<<(pwVar9,l_local._4_4_);
        std::__cxx11::wostringstream::str();
        local_458 = (wstring_view)
                    std::__cxx11::wstring::operator_cast_to_basic_string_view(local_478);
        throw_runtime_error(&local_458,
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                            ,0x2e0);
      case gt:
        iVar3 = tri_compare(dVar11,dVar10);
        local_68b = iVar3 != -1 && iVar3 != 0;
        value::value(__return_storage_ptr__,local_68b);
        return __return_storage_ptr__;
      case lt:
        iVar3 = tri_compare(dVar10,dVar11);
        local_689 = iVar3 != -1 && iVar3 != 0;
        value::value(__return_storage_ptr__,local_689);
        return __return_storage_ptr__;
      }
    }
    if ((l_local._4_4_ == equalequal) || (l_local._4_4_ == notequal)) {
      local_6a1 = compare_equal(r_local,local_30);
      if (l_local._4_4_ != equalequal) {
        local_6a1 = local_6a1 ^ 0xff;
      }
      value::value(__return_storage_ptr__,(bool)(local_6a1 & 1));
      return __return_storage_ptr__;
    }
    if ((l_local._4_4_ == equalequalequal) || (l_local._4_4_ == notequalequal)) {
      local_6a2 = compare_strict_equal(r_local,local_30);
      if (l_local._4_4_ != equalequalequal) {
        local_6a2 = local_6a2 ^ 0xff;
      }
      value::value(__return_storage_ptr__,(bool)(local_6a2 & 1));
      return __return_storage_ptr__;
    }
  }
  dVar10 = to_number(r_local);
  this_00 = local_30;
  dVar11 = to_number(local_30);
  switch(l_local._4_4_) {
  case rshiftshift:
    uVar5 = to_uint32((mjs *)this_00,dVar10);
    uVar6 = to_uint32((mjs *)this_00,dVar11);
    value::value(__return_storage_ptr__,(double)(uVar5 >> ((byte)uVar6 & 0x1f)));
    break;
  default:
    std::__cxx11::wostringstream::wostringstream(local_608);
    pwVar9 = std::operator<<((wostream *)local_608,"Not implemented: ");
    mjs::operator<<(pwVar9,l_local._4_4_);
    std::__cxx11::wostringstream::str();
    local_618 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_638);
    throw_runtime_error(&local_618,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                        ,0x2f8);
  case lshift:
    iVar4 = to_int32((mjs *)this_00,dVar10);
    uVar5 = to_uint32((mjs *)this_00,dVar11);
    value::value(__return_storage_ptr__,(double)(iVar4 << ((byte)uVar5 & 0x1f)));
    break;
  case rshift:
    iVar4 = to_int32((mjs *)this_00,dVar10);
    uVar5 = to_uint32((mjs *)this_00,dVar11);
    value::value(__return_storage_ptr__,(double)(iVar4 >> ((byte)uVar5 & 0x1f)));
    break;
  case plus:
    value::value(__return_storage_ptr__,dVar10 + dVar11);
    break;
  case minus:
    value::value(__return_storage_ptr__,dVar10 - dVar11);
    break;
  case multiply:
    value::value(__return_storage_ptr__,dVar10 * dVar11);
    break;
  case divide:
    value::value(__return_storage_ptr__,dVar10 / dVar11);
    break;
  case and_:
    uVar7 = to_int32((mjs *)this_00,dVar10);
    uVar8 = to_int32((mjs *)this_00,dVar11);
    value::value(__return_storage_ptr__,(double)(int)(uVar7 & uVar8));
    break;
  case or_:
    uVar7 = to_int32((mjs *)this_00,dVar10);
    uVar8 = to_int32((mjs *)this_00,dVar11);
    value::value(__return_storage_ptr__,(double)(int)(uVar7 | uVar8));
    break;
  case xor_:
    uVar7 = to_int32((mjs *)this_00,dVar10);
    uVar8 = to_int32((mjs *)this_00,dVar11);
    value::value(__return_storage_ptr__,(double)(int)(uVar7 ^ uVar8));
    break;
  case mod:
    dVar10 = fmod(dVar10,dVar11);
    value::value(__return_storage_ptr__,dVar10);
  }
  return __return_storage_ptr__;
}

Assistant:

value do_binary_op(const token_type op, value& l, value& r) {
        if (op == token_type::plus) {
            l = to_primitive(l);
            r = to_primitive(r);
            if (l.type() == value_type::string || r.type() == value_type::string) {
                auto ls = to_string(heap_, l);
                auto rs = to_string(heap_, r);
                return value{ls + rs};
            }
            // Otherwise handle like the other operators
        } else if (is_relational(op)) {
            l = to_primitive(l, value_type::number);
            r = to_primitive(r, value_type::number);
            if (l.type() == value_type::string && r.type() == value_type::string) {
                // TODO: See §11.8.5 step 16-21
                NOT_IMPLEMENTED(op);
            }
            const auto ln = to_number(l);
            const auto rn = to_number(r);
            int res;
            switch (op) {
            case token_type::lt:
                res = tri_compare(ln, rn);
                return value{res == -1 ? false : static_cast<bool>(res)};
            case token_type::ltequal:
                res = tri_compare(rn, ln);
                return value{res == -1 || res == 1 ? false : true};
            case token_type::gt:
                res = tri_compare(rn, ln);
                return value{res == -1 ? false : static_cast<bool>(res)};
            case token_type::gtequal:
                res = tri_compare(ln, rn);
                return value{res == -1 || res == 1 ? false : true};
            default: NOT_IMPLEMENTED(op);
            }
        } else if (op == token_type::equalequal || op == token_type::notequal) {
            const bool eq = compare_equal(l ,r);
            return value{op == token_type::equalequal ? eq : !eq};
        } else if (op == token_type::equalequalequal || op == token_type::notequalequal) {
            const bool eq = compare_strict_equal(l ,r);
            return value{op == token_type::equalequalequal ? eq : !eq};
        }

        const auto ln = to_number(l);
        const auto rn = to_number(r);
        switch (op) {
        case token_type::plus:         return value{ln + rn};
        case token_type::minus:        return value{ln - rn};
        case token_type::multiply:     return value{ln * rn};
        case token_type::divide:       return value{ln / rn};
        case token_type::mod:          return value{std::fmod(ln, rn)};
        case token_type::lshift:       return value{static_cast<double>(to_int32(ln) << (to_uint32(rn) & 0x1f))};
        case token_type::rshift:       return value{static_cast<double>(to_int32(ln) >> (to_uint32(rn) & 0x1f))};
        case token_type::rshiftshift:  return value{static_cast<double>(to_uint32(ln) >> (to_uint32(rn) & 0x1f))};
        case token_type::and_:         return value{static_cast<double>(to_int32(ln) & to_int32(rn))};
        case token_type::xor_:         return value{static_cast<double>(to_int32(ln) ^ to_int32(rn))};
        case token_type::or_:          return value{static_cast<double>(to_int32(ln) | to_int32(rn))};
        default: NOT_IMPLEMENTED(op);
        }
    }